

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

Cba_Man_t *
Cba_ManAlloc(char *pFileName,int nNtks,Abc_Nam_t *pStrs,Abc_Nam_t *pFuns,Abc_Nam_t *pMods,
            Hash_IntMan_t *vHash)

{
  Cba_Man_t *pCVar1;
  char *pcVar2;
  Hash_IntMan_t *local_60;
  Abc_Nam_t *local_58;
  Abc_Nam_t *local_50;
  Abc_Nam_t *local_48;
  Cba_Man_t *pNew;
  Hash_IntMan_t *vHash_local;
  Abc_Nam_t *pMods_local;
  Abc_Nam_t *pFuns_local;
  Abc_Nam_t *pStrs_local;
  int nNtks_local;
  char *pFileName_local;
  
  pCVar1 = (Cba_Man_t *)calloc(1,0x658);
  pcVar2 = Extra_FileDesignName(pFileName);
  pCVar1->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(pFileName);
  pCVar1->pSpec = pcVar2;
  local_48 = pStrs;
  if (pStrs == (Abc_Nam_t *)0x0) {
    local_48 = Abc_NamStart(1000,0x18);
  }
  pCVar1->pStrs = local_48;
  local_50 = pFuns;
  if (pFuns == (Abc_Nam_t *)0x0) {
    local_50 = Abc_NamStart(100,0x18);
  }
  pCVar1->pFuns = local_50;
  local_58 = pMods;
  if (pMods == (Abc_Nam_t *)0x0) {
    local_58 = Abc_NamStart(100,0x18);
  }
  pCVar1->pMods = local_58;
  local_60 = vHash;
  if (vHash == (Hash_IntMan_t *)0x0) {
    local_60 = Hash_IntManStart(1000);
  }
  pCVar1->vHash = local_60;
  if (pFuns == (Abc_Nam_t *)0x0) {
    Abc_NamStrFindOrAdd(pCVar1->pFuns,"1\'b0",(int *)0x0);
    Abc_NamStrFindOrAdd(pCVar1->pFuns,"1\'b1",(int *)0x0);
    Abc_NamStrFindOrAdd(pCVar1->pFuns,"1\'bx",(int *)0x0);
    Abc_NamStrFindOrAdd(pCVar1->pFuns,"1\'bz",(int *)0x0);
  }
  Vec_PtrGrow(&pCVar1->vNtks,nNtks + 1);
  Vec_PtrPush(&pCVar1->vNtks,(void *)0x0);
  pCVar1->iRoot = 1;
  return pCVar1;
}

Assistant:

static inline Cba_Man_t * Cba_ManAlloc( char * pFileName, int nNtks, Abc_Nam_t * pStrs, Abc_Nam_t * pFuns, Abc_Nam_t * pMods, Hash_IntMan_t * vHash )
{
    Cba_Man_t * pNew = ABC_CALLOC( Cba_Man_t, 1 );
    pNew->pName = Extra_FileDesignName( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    pNew->pStrs = pStrs ? pStrs : Abc_NamStart( 1000, 24 );
    pNew->pFuns = pFuns ? pFuns : Abc_NamStart( 100, 24 );
    pNew->pMods = pMods ? pMods : Abc_NamStart( 100, 24 );
    pNew->vHash = vHash ? vHash : Hash_IntManStart( 1000 );
    if ( pFuns == NULL )
    {
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b0", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b1", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bx", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bz", NULL);
    }
//    if ( vHash == NULL )
//        Hash_Int2ManInsert( pNew->vHash, 0, 0, 0 );
    Vec_PtrGrow( &pNew->vNtks,  nNtks+1 ); Vec_PtrPush( &pNew->vNtks, NULL );
    // set default root module
    pNew->iRoot = 1;
    return pNew;
}